

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O0

bool __thiscall
database::ComparableString::operator<(ComparableString *this,ComparableString *string)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  size_t rhs_length;
  char *local_58;
  char *rhs;
  size_t lhs_length;
  char *local_28;
  char *lhs;
  ComparableString *string_local;
  ComparableString *this_local;
  
  lhs = (char *)string;
  string_local = this;
  _ToLowerCase((string *)&lhs_length,this,&this->m_string);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)&lhs_length);
  local_28 = pcVar2;
  rhs = (char *)std::__cxx11::string::length();
  _ToLowerCase((string *)&rhs_length,this,(string *)lhs);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)&rhs_length);
  local_58 = pcVar2;
  lVar3 = std::__cxx11::string::length();
  bVar1 = std::lexicographical_compare<char_const*,char_const*>
                    (local_28,local_28 + (long)rhs,local_58,local_58 + lVar3);
  return bVar1;
}

Assistant:

inline bool operator < (const database::ComparableString& string) const
    {
      const char* lhs = _ToLowerCase(this -> m_string).c_str();
      std::size_t lhs_length = this -> m_string.length();
      const char* rhs = _ToLowerCase(string.m_string).c_str();
      std::size_t rhs_length = string.m_string.length();
      if(std::lexicographical_compare(lhs,lhs + lhs_length,rhs,rhs + rhs_length))
        return true;
      else
        return false;
    }